

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_grid_mesh.h
# Opt level: O3

PrimInfoMB * __thiscall
embree::avx::GridMeshISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,GridMeshISA *this,mvector<PrimRefMB> *prims,
          mvector<SubGridBuildData> *sgrids,BBox1f *t0t1,range<unsigned_long> *r,size_t k,
          uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  ushort uVar3;
  ushort uVar4;
  long lVar5;
  size_t sVar6;
  PrimRefMB *pPVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  BufferView<embree::Vec3fa> *pBVar21;
  ulong uVar22;
  uint uVar23;
  undefined1 (*pauVar24) [16];
  ulong uVar25;
  BufferView<embree::Vec3fa> *pBVar26;
  size_t *psVar27;
  ulong uVar28;
  undefined4 uVar29;
  ulong uVar30;
  uint uVar31;
  unsigned_long uVar32;
  uint uVar33;
  ulong uVar34;
  size_t sVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  size_t index;
  long lVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  float fVar51;
  float fVar52;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar62;
  undefined1 auVar56 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar57;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar58;
  float fVar60;
  float fVar61;
  undefined1 auVar59 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar65;
  undefined1 auVar66 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar72;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar73;
  undefined1 auVar74 [64];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  float fVar77;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar78;
  undefined1 auVar79 [64];
  float fVar80;
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [64];
  undefined1 auVar87 [16];
  size_t local_160;
  uint local_158;
  unsigned_long local_110;
  size_t local_100;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  uVar25 = r->_begin;
  uVar32 = r->_end;
  if (uVar25 < uVar32) {
    local_100 = k;
    auVar86 = ZEXT464(0x3f800000);
    auVar69 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar68._8_4_ = 0xff800000;
    auVar68._0_8_ = 0xff800000ff800000;
    auVar68._12_4_ = 0xff800000;
    auVar59 = ZEXT1664(auVar68);
    auVar55._8_4_ = 0x7f800000;
    auVar55._0_8_ = 0x7f8000007f800000;
    auVar55._12_4_ = 0x7f800000;
    auVar76 = ZEXT1664(auVar55);
    local_110 = 0;
    auVar87._8_4_ = 0xddccb9a2;
    auVar87._0_8_ = 0xddccb9a2ddccb9a2;
    auVar87._12_4_ = 0xddccb9a2;
    auVar85._8_4_ = 0x5dccb9a2;
    auVar85._0_8_ = 0x5dccb9a25dccb9a2;
    auVar85._12_4_ = 0x5dccb9a2;
    auVar83 = ZEXT1664(auVar55);
    auVar81 = ZEXT1664(auVar68);
    auVar79 = ZEXT1664(auVar55);
    auVar66 = ZEXT1664(auVar68);
    local_160 = 0;
    uVar34 = 0;
    auVar74 = ZEXT1664(auVar55);
    do {
      BVar2 = (this->super_GridMesh).super_Geometry.time_range;
      auVar43._8_8_ = 0;
      auVar43._0_4_ = BVar2.lower;
      auVar43._4_4_ = BVar2.upper;
      fVar41 = BVar2.lower;
      auVar68 = vmovshdup_avx(auVar43);
      fVar14 = auVar68._0_4_ - fVar41;
      if (uVar25 < *(ulong *)&(this->super_GridMesh).field_0x70) {
        lVar5 = *(long *)&(this->super_GridMesh).super_Geometry.field_0x58;
        uVar17 = (this->super_GridMesh).vertices0.super_RawBufferView.num;
        lVar40 = *(long *)&(this->super_GridMesh).field_0x68 * uVar25;
        uVar31 = *(uint *)(lVar5 + lVar40);
        if (uVar31 < uVar17) {
          uVar3 = *(ushort *)(lVar5 + 10 + lVar40);
          uVar28 = (ulong)uVar3;
          uVar23 = *(uint *)(lVar5 + 4 + lVar40);
          uVar4 = *(ushort *)(lVar5 + 8 + lVar40);
          uVar22 = (ulong)uVar4;
          if (((uint)uVar4 + uVar23 * (uVar3 - 1) + uVar31) - 1 < uVar17) {
            if (uVar3 != 0) {
              fVar1 = (this->super_GridMesh).super_Geometry.fnumTimeSegments;
              auVar68 = ZEXT416((uint)(fVar1 * ((t0t1->lower - fVar41) / fVar14) * 1.0000002));
              auVar68 = vroundss_avx(auVar68,auVar68,9);
              auVar68 = vmaxss_avx(ZEXT816(0),auVar68);
              uVar18 = (uint)auVar68._0_4_;
              auVar68 = ZEXT416((uint)(fVar1 * ((t0t1->upper - fVar41) / fVar14) * 0.99999976));
              auVar68 = vroundss_avx(auVar68,auVar68,10);
              auVar68 = vminss_avx(auVar68,ZEXT416((uint)fVar1));
              uVar17 = 0;
              do {
                if (uVar4 != 0) {
                  uVar39 = 0;
                  do {
                    if (uVar18 <= (uint)(int)auVar68._0_4_) {
                      uVar19 = (long)(int)uVar18;
                      psVar27 = &(this->super_GridMesh).vertices.items[(int)uVar18].
                                 super_RawBufferView.stride;
                      do {
                        auVar55 = vcmpps_avx(*(undefined1 (*) [16])
                                              (((RawBufferView *)(psVar27 + -2))->ptr_ofs +
                                              *psVar27 * (uVar17 * uVar23 + (ulong)uVar31 + uVar39))
                                             ,auVar87,6);
                        auVar43 = vcmpps_avx(*(undefined1 (*) [16])
                                              (((RawBufferView *)(psVar27 + -2))->ptr_ofs +
                                              *psVar27 * (uVar17 * uVar23 + (ulong)uVar31 + uVar39))
                                             ,auVar85,1);
                        auVar55 = vandps_avx(auVar55,auVar43);
                        uVar29 = vmovmskps_avx(auVar55);
                        if ((~(byte)uVar29 & 7) != 0) goto LAB_0124fe0d;
                        uVar19 = uVar19 + 1;
                        psVar27 = psVar27 + 7;
                      } while (uVar19 <= (ulong)(long)(int)auVar68._0_4_);
                    }
                    uVar39 = uVar39 + 1;
                  } while (uVar39 != uVar22);
                }
                uVar17 = uVar17 + 1;
              } while (uVar17 != uVar28);
              if (uVar3 == 1) goto LAB_0124fe0d;
            }
            uVar31 = 0;
            do {
              if ((short)uVar22 == 1) {
                uVar22 = 1;
              }
              else {
                uVar17 = (ulong)uVar31;
                sVar35 = uVar34;
                uVar23 = 0;
                do {
                  uVar28 = (ulong)uVar23;
                  uVar34 = uVar28 + 3;
                  fVar14 = (this->super_GridMesh).super_Geometry.fnumTimeSegments;
                  fVar41 = (this->super_GridMesh).super_Geometry.time_range.lower;
                  fVar42 = (this->super_GridMesh).super_Geometry.time_range.upper - fVar41;
                  fVar77 = (t0t1->lower - fVar41) / fVar42;
                  fVar42 = (t0t1->upper - fVar41) / fVar42;
                  fVar41 = fVar14 * fVar77;
                  fVar1 = fVar14 * fVar42;
                  auVar43 = vroundss_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41),9);
                  auVar54 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),10);
                  auVar68 = vmaxss_avx(auVar43,ZEXT416(0));
                  auVar55 = vminss_avx(auVar54,ZEXT416((uint)fVar14));
                  iVar15 = (int)auVar43._0_4_;
                  if ((int)auVar43._0_4_ < 0) {
                    iVar15 = -1;
                  }
                  iVar16 = (int)fVar14 + 1;
                  if ((int)auVar54._0_4_ < (int)fVar14 + 1) {
                    iVar16 = (int)auVar54._0_4_;
                  }
                  uVar3 = *(ushort *)(lVar5 + 10 + lVar40);
                  uVar19 = (ulong)uVar3;
                  uVar39 = uVar19;
                  if (uVar17 + 3 < uVar19) {
                    uVar39 = uVar17 + 3;
                  }
                  auVar56 = auVar86._0_16_;
                  fVar48 = auVar55._0_4_;
                  fVar80 = auVar68._0_4_;
                  auVar46 = auVar76._0_16_;
                  local_158 = (uint)uVar3;
                  uVar18 = (uint)uVar22;
                  auVar54 = auVar46;
                  auVar43 = auVar46;
                  auVar55 = auVar46;
                  auVar68 = auVar46;
                  if (uVar17 < uVar19) {
                    lVar20 = (long)(int)fVar80;
                    pBVar26 = (this->super_GridMesh).vertices.items;
                    pBVar21 = pBVar26 + lVar20;
                    uVar19 = uVar22;
                    if (uVar34 < uVar22) {
                      uVar19 = uVar34;
                    }
                    auVar86 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000))
                                      );
                    auVar84 = ZEXT1664(auVar46);
                    uVar30 = uVar17;
                    do {
                      if (uVar23 < uVar18) {
                        sVar6 = (pBVar21->super_RawBufferView).stride;
                        pauVar24 = (undefined1 (*) [16])
                                   ((pBVar21->super_RawBufferView).ptr_ofs +
                                   (*(uint *)(lVar5 + lVar40) + uVar28 +
                                   *(uint *)(lVar5 + 4 + lVar40) * uVar30) * sVar6);
                        lVar36 = uVar19 - uVar28;
                        do {
                          auVar43 = *pauVar24;
                          auVar54 = vcmpps_avx(auVar43,auVar87,6);
                          auVar64 = vcmpps_avx(auVar43,auVar85,1);
                          auVar54 = vandps_avx(auVar54,auVar64);
                          uVar29 = vmovmskps_avx(auVar54);
                          if ((~(byte)uVar29 & 7) != 0) {
                            auVar63._8_4_ = 0xff800000;
                            auVar63._0_8_ = 0xff800000ff800000;
                            auVar63._12_4_ = 0xff800000;
                            auVar43 = auVar46;
                            goto LAB_0124f79b;
                          }
                          auVar54 = vminps_avx(auVar84._0_16_,auVar43);
                          auVar84 = ZEXT1664(auVar54);
                          auVar43 = vmaxps_avx(auVar86._0_16_,auVar43);
                          auVar86 = ZEXT1664(auVar43);
                          pauVar24 = (undefined1 (*) [16])(*pauVar24 + sVar6);
                          lVar36 = lVar36 + -1;
                        } while (lVar36 != 0);
                      }
                      auVar43 = auVar84._0_16_;
                      auVar63 = auVar86._0_16_;
                      uVar30 = uVar30 + 1;
                    } while (uVar30 != uVar39);
LAB_0124f79b:
                    lVar36 = (long)(int)fVar48;
                    pBVar26 = pBVar26 + lVar36;
                    uVar19 = uVar22;
                    if (uVar34 < uVar22) {
                      uVar19 = uVar34;
                    }
                    auVar86 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000))
                                      );
                    auVar84 = ZEXT1664(auVar46);
                    uVar30 = uVar17;
                    do {
                      if (uVar23 < uVar18) {
                        sVar6 = (pBVar26->super_RawBufferView).stride;
                        pauVar24 = (undefined1 (*) [16])
                                   ((pBVar26->super_RawBufferView).ptr_ofs +
                                   (*(uint *)(lVar5 + lVar40) + uVar28 +
                                   *(uint *)(lVar5 + 4 + lVar40) * uVar30) * sVar6);
                        lVar37 = uVar19 - uVar28;
                        do {
                          auVar54 = *pauVar24;
                          auVar64 = vcmpps_avx(auVar54,auVar87,6);
                          auVar50 = vcmpps_avx(auVar54,auVar85,1);
                          auVar64 = vandps_avx(auVar64,auVar50);
                          uVar29 = vmovmskps_avx(auVar64);
                          if ((~(byte)uVar29 & 7) != 0) {
                            auVar67._8_4_ = 0xff800000;
                            auVar67._0_8_ = 0xff800000ff800000;
                            auVar67._12_4_ = 0xff800000;
                            auVar54 = auVar46;
                            goto LAB_0124f83e;
                          }
                          auVar64 = vminps_avx(auVar84._0_16_,auVar54);
                          auVar84 = ZEXT1664(auVar64);
                          auVar54 = vmaxps_avx(auVar86._0_16_,auVar54);
                          auVar86 = ZEXT1664(auVar54);
                          pauVar24 = (undefined1 (*) [16])(*pauVar24 + sVar6);
                          lVar37 = lVar37 + -1;
                        } while (lVar37 != 0);
                      }
                      auVar54 = auVar84._0_16_;
                      auVar67 = auVar86._0_16_;
                      uVar30 = uVar30 + 1;
                    } while (uVar30 != uVar39);
LAB_0124f83e:
                    uVar19 = (ulong)(uint)(iVar16 - iVar15);
                    if (iVar16 - iVar15 != 1) {
                      if (uVar31 < local_158) {
                        pBVar26 = (this->super_GridMesh).vertices.items;
                        uVar19 = uVar22;
                        if (uVar34 < uVar22) {
                          uVar19 = uVar34;
                        }
                        auVar76 = ZEXT1664(CONCAT412(0xff800000,
                                                     CONCAT48(0xff800000,0xff800000ff800000)));
                        auVar86 = ZEXT1664(auVar46);
                        uVar30 = uVar17;
                        do {
                          if (uVar23 < uVar18) {
                            sVar6 = pBVar26[lVar20 + 1].super_RawBufferView.stride;
                            pauVar24 = (undefined1 (*) [16])
                                       (pBVar26[lVar20 + 1].super_RawBufferView.ptr_ofs +
                                       (*(uint *)(lVar5 + lVar40) + uVar28 +
                                       *(uint *)(lVar5 + 4 + lVar40) * uVar30) * sVar6);
                            lVar37 = uVar19 - uVar28;
                            do {
                              auVar68 = *pauVar24;
                              auVar55 = vcmpps_avx(auVar68,auVar87,6);
                              auVar64 = vcmpps_avx(auVar68,auVar85,1);
                              auVar55 = vandps_avx(auVar55,auVar64);
                              uVar29 = vmovmskps_avx(auVar55);
                              if ((~(byte)uVar29 & 7) != 0) {
                                auVar50._8_4_ = 0xff800000;
                                auVar50._0_8_ = 0xff800000ff800000;
                                auVar50._12_4_ = 0xff800000;
                                auVar55 = auVar46;
                                goto LAB_0124f99e;
                              }
                              auVar55 = vminps_avx(auVar86._0_16_,auVar68);
                              auVar86 = ZEXT1664(auVar55);
                              auVar68 = vmaxps_avx(auVar76._0_16_,auVar68);
                              auVar76 = ZEXT1664(auVar68);
                              pauVar24 = (undefined1 (*) [16])(*pauVar24 + sVar6);
                              lVar37 = lVar37 + -1;
                            } while (lVar37 != 0);
                          }
                          auVar50 = auVar76._0_16_;
                          auVar55 = auVar86._0_16_;
                          uVar30 = uVar30 + 1;
                        } while (uVar30 != uVar39);
LAB_0124f99e:
                        uVar19 = uVar22;
                        if (uVar34 < uVar22) {
                          uVar19 = uVar34;
                        }
                        uVar19 = uVar19 - uVar28;
                        auVar86 = ZEXT1664(CONCAT412(0xff800000,
                                                     CONCAT48(0xff800000,0xff800000ff800000)));
                        auVar76 = ZEXT1664(auVar46);
                        uVar30 = uVar17;
                        do {
                          if (uVar23 < uVar18) {
                            sVar6 = pBVar26[lVar36 + -1].super_RawBufferView.stride;
                            pauVar24 = (undefined1 (*) [16])
                                       (pBVar26[lVar36 + -1].super_RawBufferView.ptr_ofs +
                                       (*(uint *)(lVar5 + lVar40) + uVar28 +
                                       *(uint *)(lVar5 + 4 + lVar40) * uVar30) * sVar6);
                            uVar38 = uVar19;
                            do {
                              auVar68 = *pauVar24;
                              auVar64 = vcmpps_avx(auVar68,auVar87,6);
                              auVar47 = vcmpps_avx(auVar68,auVar85,1);
                              auVar64 = vandps_avx(auVar47,auVar64);
                              uVar29 = vmovmskps_avx(auVar64);
                              if ((~(byte)uVar29 & 7) != 0) {
                                auVar64._8_4_ = 0xff800000;
                                auVar64._0_8_ = 0xff800000ff800000;
                                auVar64._12_4_ = 0xff800000;
                                auVar68 = auVar46;
                                goto LAB_0124fa46;
                              }
                              auVar64 = vminps_avx(auVar76._0_16_,auVar68);
                              auVar76 = ZEXT1664(auVar64);
                              auVar68 = vmaxps_avx(auVar86._0_16_,auVar68);
                              auVar86 = ZEXT1664(auVar68);
                              pauVar24 = (undefined1 (*) [16])(*pauVar24 + sVar6);
                              uVar38 = uVar38 - 1;
                            } while (uVar38 != 0);
                          }
                          auVar68 = auVar76._0_16_;
                          auVar64 = auVar86._0_16_;
                          uVar30 = uVar30 + 1;
                        } while (uVar30 != uVar39);
                      }
                      else {
                        auVar64._8_4_ = 0xff800000;
                        auVar64._0_8_ = 0xff800000ff800000;
                        auVar64._12_4_ = 0xff800000;
                        auVar50 = auVar64;
                      }
                      goto LAB_0124fa46;
                    }
LAB_0124f85c:
                    auVar68 = vmaxss_avx(ZEXT416((uint)(fVar41 - fVar80)),ZEXT816(0) << 0x40);
                    auVar55 = vshufps_avx(auVar68,auVar68,0);
                    auVar68 = ZEXT416((uint)(1.0 - auVar68._0_4_));
                    auVar68 = vshufps_avx(auVar68,auVar68,0);
                    auVar47._0_4_ = auVar43._0_4_ * auVar68._0_4_ + auVar55._0_4_ * auVar54._0_4_;
                    auVar47._4_4_ = auVar43._4_4_ * auVar68._4_4_ + auVar55._4_4_ * auVar54._4_4_;
                    auVar47._8_4_ = auVar43._8_4_ * auVar68._8_4_ + auVar55._8_4_ * auVar54._8_4_;
                    auVar47._12_4_ =
                         auVar43._12_4_ * auVar68._12_4_ + auVar55._12_4_ * auVar54._12_4_;
                    auVar46._0_4_ = auVar63._0_4_ * auVar68._0_4_ + auVar55._0_4_ * auVar67._0_4_;
                    auVar46._4_4_ = auVar63._4_4_ * auVar68._4_4_ + auVar55._4_4_ * auVar67._4_4_;
                    auVar46._8_4_ = auVar63._8_4_ * auVar68._8_4_ + auVar55._8_4_ * auVar67._8_4_;
                    auVar46._12_4_ =
                         auVar63._12_4_ * auVar68._12_4_ + auVar55._12_4_ * auVar67._12_4_;
                    auVar68 = vmaxss_avx(ZEXT416((uint)(fVar48 - fVar1)),ZEXT816(0) << 0x40);
                    auVar55 = vshufps_avx(auVar68,auVar68,0);
                    auVar68 = ZEXT416((uint)(1.0 - auVar68._0_4_));
                    auVar68 = vshufps_avx(auVar68,auVar68,0);
                    auVar49._0_4_ = auVar43._0_4_ * auVar55._0_4_ + auVar68._0_4_ * auVar54._0_4_;
                    auVar49._4_4_ = auVar43._4_4_ * auVar55._4_4_ + auVar68._4_4_ * auVar54._4_4_;
                    auVar49._8_4_ = auVar43._8_4_ * auVar55._8_4_ + auVar68._8_4_ * auVar54._8_4_;
                    auVar49._12_4_ =
                         auVar43._12_4_ * auVar55._12_4_ + auVar68._12_4_ * auVar54._12_4_;
                    auVar54._0_4_ = auVar63._0_4_ * auVar55._0_4_ + auVar68._0_4_ * auVar67._0_4_;
                    auVar54._4_4_ = auVar63._4_4_ * auVar55._4_4_ + auVar68._4_4_ * auVar67._4_4_;
                    auVar54._8_4_ = auVar63._8_4_ * auVar55._8_4_ + auVar68._8_4_ * auVar67._8_4_;
                    auVar54._12_4_ =
                         auVar63._12_4_ * auVar55._12_4_ + auVar68._12_4_ * auVar67._12_4_;
                    uVar22 = uVar19;
                  }
                  else {
                    uVar19 = (ulong)(uint)(iVar16 - iVar15);
                    auVar63._8_4_ = 0xff800000;
                    auVar63._0_8_ = 0xff800000ff800000;
                    auVar63._12_4_ = 0xff800000;
                    auVar64 = auVar63;
                    auVar50 = auVar63;
                    auVar67 = auVar63;
                    if (iVar16 - iVar15 == 1) goto LAB_0124f85c;
LAB_0124fa46:
                    auVar46 = vmaxss_avx(ZEXT416((uint)(fVar41 - fVar80)),ZEXT816(0) << 0x40);
                    auVar49 = vshufps_avx(auVar46,auVar46,0);
                    auVar46 = ZEXT416((uint)(1.0 - auVar46._0_4_));
                    auVar75 = vshufps_avx(auVar46,auVar46,0);
                    auVar47._0_4_ = auVar75._0_4_ * auVar43._0_4_ + auVar49._0_4_ * auVar55._0_4_;
                    auVar47._4_4_ = auVar75._4_4_ * auVar43._4_4_ + auVar49._4_4_ * auVar55._4_4_;
                    auVar47._8_4_ = auVar75._8_4_ * auVar43._8_4_ + auVar49._8_4_ * auVar55._8_4_;
                    auVar47._12_4_ =
                         auVar75._12_4_ * auVar43._12_4_ + auVar49._12_4_ * auVar55._12_4_;
                    auVar46._0_4_ = auVar75._0_4_ * auVar63._0_4_ + auVar49._0_4_ * auVar50._0_4_;
                    auVar46._4_4_ = auVar75._4_4_ * auVar63._4_4_ + auVar49._4_4_ * auVar50._4_4_;
                    auVar46._8_4_ = auVar75._8_4_ * auVar63._8_4_ + auVar49._8_4_ * auVar50._8_4_;
                    auVar46._12_4_ =
                         auVar75._12_4_ * auVar63._12_4_ + auVar49._12_4_ * auVar50._12_4_;
                    auVar55 = vmaxss_avx(ZEXT416((uint)(fVar48 - fVar1)),ZEXT816(0) << 0x40);
                    auVar43 = vshufps_avx(auVar55,auVar55,0);
                    auVar55 = ZEXT416((uint)(1.0 - auVar55._0_4_));
                    auVar55 = vshufps_avx(auVar55,auVar55,0);
                    auVar49._0_4_ = auVar55._0_4_ * auVar54._0_4_ + auVar43._0_4_ * auVar68._0_4_;
                    auVar49._4_4_ = auVar55._4_4_ * auVar54._4_4_ + auVar43._4_4_ * auVar68._4_4_;
                    auVar49._8_4_ = auVar55._8_4_ * auVar54._8_4_ + auVar43._8_4_ * auVar68._8_4_;
                    auVar49._12_4_ =
                         auVar55._12_4_ * auVar54._12_4_ + auVar43._12_4_ * auVar68._12_4_;
                    auVar54._0_4_ = auVar55._0_4_ * auVar67._0_4_ + auVar43._0_4_ * auVar64._0_4_;
                    auVar54._4_4_ = auVar55._4_4_ * auVar67._4_4_ + auVar43._4_4_ * auVar64._4_4_;
                    auVar54._8_4_ = auVar55._8_4_ * auVar67._8_4_ + auVar43._8_4_ * auVar64._8_4_;
                    auVar54._12_4_ =
                         auVar55._12_4_ * auVar67._12_4_ + auVar43._12_4_ * auVar64._12_4_;
                    if ((int)(iVar15 + 1U) < iVar16) {
                      uVar19 = (ulong)(iVar15 + 1U);
                      if (uVar22 <= uVar34) {
                        uVar34 = uVar22;
                      }
                      auVar75._8_4_ = 0x7f800000;
                      auVar75._0_8_ = 0x7f8000007f800000;
                      auVar75._12_4_ = 0x7f800000;
                      auVar76 = ZEXT1664(auVar75);
                      do {
                        auVar44._8_4_ = 0xff800000;
                        auVar44._0_8_ = 0xff800000ff800000;
                        auVar44._12_4_ = 0xff800000;
                        auVar68 = auVar75;
                        if (uVar31 < local_158) {
                          pBVar26 = (this->super_GridMesh).vertices.items + uVar19;
                          auVar86 = ZEXT1664(CONCAT412(0xff800000,
                                                       CONCAT48(0xff800000,0xff800000ff800000)));
                          auVar84 = ZEXT1664(auVar75);
                          uVar30 = uVar17;
                          do {
                            if (uVar23 < uVar18) {
                              sVar6 = (pBVar26->super_RawBufferView).stride;
                              pauVar24 = (undefined1 (*) [16])
                                         ((pBVar26->super_RawBufferView).ptr_ofs +
                                         (*(uint *)(lVar5 + lVar40) + uVar28 +
                                         *(uint *)(lVar5 + 4 + lVar40) * uVar30) * sVar6);
                              lVar20 = uVar34 - uVar28;
                              do {
                                auVar68 = *pauVar24;
                                auVar55 = vcmpps_avx(auVar68,auVar87,6);
                                auVar43 = vcmpps_avx(auVar68,auVar85,1);
                                auVar55 = vandps_avx(auVar55,auVar43);
                                uVar29 = vmovmskps_avx(auVar55);
                                if ((~(byte)uVar29 & 7) != 0) {
                                  auVar44._8_4_ = 0xff800000;
                                  auVar44._0_8_ = 0xff800000ff800000;
                                  auVar44._12_4_ = 0xff800000;
                                  auVar68 = auVar75;
                                  goto LAB_0124fba2;
                                }
                                auVar55 = vminps_avx(auVar84._0_16_,auVar68);
                                auVar84 = ZEXT1664(auVar55);
                                auVar68 = vmaxps_avx(auVar86._0_16_,auVar68);
                                auVar86 = ZEXT1664(auVar68);
                                pauVar24 = (undefined1 (*) [16])(*pauVar24 + sVar6);
                                lVar20 = lVar20 + -1;
                              } while (lVar20 != 0);
                            }
                            auVar44 = auVar86._0_16_;
                            auVar68 = auVar84._0_16_;
                            uVar30 = uVar30 + 1;
                          } while (uVar30 != uVar39);
                        }
LAB_0124fba2:
                        auVar70._0_4_ = ((float)(int)uVar19 / fVar14 - fVar77) / (fVar42 - fVar77);
                        auVar70._4_12_ = SUB6012((undefined1  [60])0x0,0);
                        auVar55 = vshufps_avx(auVar70,auVar70,0);
                        fVar51 = auVar49._4_4_;
                        fVar52 = auVar49._8_4_;
                        fVar53 = auVar49._12_4_;
                        auVar43 = vshufps_avx(ZEXT416((uint)(1.0 - auVar70._0_4_)),
                                              ZEXT416((uint)(1.0 - auVar70._0_4_)),0);
                        fVar41 = auVar47._4_4_;
                        fVar48 = auVar47._8_4_;
                        fVar12 = auVar47._12_4_;
                        auVar82._0_4_ =
                             auVar49._0_4_ * auVar55._0_4_ + auVar43._0_4_ * auVar47._0_4_;
                        auVar82._4_4_ = fVar51 * auVar55._4_4_ + auVar43._4_4_ * fVar41;
                        auVar82._8_4_ = fVar52 * auVar55._8_4_ + auVar43._8_4_ * fVar48;
                        auVar82._12_4_ = fVar53 * auVar55._12_4_ + auVar43._12_4_ * fVar12;
                        auVar68 = vsubps_avx(auVar68,auVar82);
                        fVar60 = auVar54._4_4_;
                        fVar61 = auVar54._8_4_;
                        fVar62 = auVar54._12_4_;
                        fVar1 = auVar46._4_4_;
                        fVar80 = auVar46._8_4_;
                        fVar13 = auVar46._12_4_;
                        auVar71._0_4_ =
                             auVar43._0_4_ * auVar46._0_4_ + auVar54._0_4_ * auVar55._0_4_;
                        auVar71._4_4_ = auVar43._4_4_ * fVar1 + fVar60 * auVar55._4_4_;
                        auVar71._8_4_ = auVar43._8_4_ * fVar80 + fVar61 * auVar55._8_4_;
                        auVar71._12_4_ = auVar43._12_4_ * fVar13 + fVar62 * auVar55._12_4_;
                        auVar43 = vsubps_avx(auVar44,auVar71);
                        auVar55 = vminps_avx(auVar68,ZEXT416(0) << 0x20);
                        auVar68 = vmaxps_avx(auVar43,ZEXT416(0) << 0x20);
                        auVar47._0_4_ = auVar47._0_4_ + auVar55._0_4_;
                        auVar47._4_4_ = fVar41 + auVar55._4_4_;
                        auVar47._8_4_ = fVar48 + auVar55._8_4_;
                        auVar47._12_4_ = fVar12 + auVar55._12_4_;
                        auVar49._0_4_ = auVar49._0_4_ + auVar55._0_4_;
                        auVar49._4_4_ = fVar51 + auVar55._4_4_;
                        auVar49._8_4_ = fVar52 + auVar55._8_4_;
                        auVar49._12_4_ = fVar53 + auVar55._12_4_;
                        auVar46._0_4_ = auVar46._0_4_ + auVar68._0_4_;
                        auVar46._4_4_ = fVar1 + auVar68._4_4_;
                        auVar46._8_4_ = fVar80 + auVar68._8_4_;
                        auVar46._12_4_ = fVar13 + auVar68._12_4_;
                        auVar54._0_4_ = auVar54._0_4_ + auVar68._0_4_;
                        auVar54._4_4_ = fVar60 + auVar68._4_4_;
                        auVar54._8_4_ = fVar61 + auVar68._8_4_;
                        auVar54._12_4_ = fVar62 + auVar68._12_4_;
                        uVar19 = uVar19 + 1;
                      } while (iVar16 != (int)uVar19);
                    }
                    else {
                      auVar76 = ZEXT1664(CONCAT412(0x7f800000,
                                                   CONCAT48(0x7f800000,0x7f8000007f800000)));
                      uVar22 = uVar19;
                    }
                  }
                  aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                          vinsertps_avx(auVar47,ZEXT416(geomID),0x30);
                  uVar33 = (this->super_GridMesh).super_Geometry.numTimeSteps - 1;
                  uVar34 = (ulong)uVar33;
                  BVar2 = (this->super_GridMesh).super_Geometry.time_range;
                  auVar45._8_8_ = 0;
                  auVar45._0_4_ = BVar2.lower;
                  auVar45._4_4_ = BVar2.upper;
                  aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                          vinsertps_avx(auVar46,ZEXT416((uint)local_100),0x30);
                  aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                           vinsertps_avx(auVar49,ZEXT416(uVar33),0x30);
                  aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                           vinsertps_avx(auVar54,ZEXT416(uVar33),0x30);
                  auVar55 = vcmpps_avx(auVar56,auVar45,1);
                  auVar43 = vinsertps_avx(auVar56,auVar45,0x50);
                  auVar68 = vblendps_avx(auVar45,auVar56,2);
                  auVar68 = vblendvps_avx(auVar68,auVar43,auVar55);
                  auVar86 = ZEXT1664(auVar68);
                  auVar56._0_4_ = aVar8.x * 0.5 + aVar10.x * 0.5 + aVar9.x * 0.5 + aVar11.x * 0.5;
                  auVar56._4_4_ = aVar8.y * 0.5 + aVar10.y * 0.5 + aVar9.y * 0.5 + aVar11.y * 0.5;
                  auVar56._8_4_ = aVar8.z * 0.5 + aVar10.z * 0.5 + aVar9.z * 0.5 + aVar11.z * 0.5;
                  auVar56._12_4_ =
                       aVar8.field_3.w * 0.5 + aVar10.field_3.w * 0.5 +
                       aVar9.field_3.w * 0.5 + aVar11.field_3.w * 0.5;
                  local_110 = local_110 + 1;
                  local_160 = local_160 + uVar34;
                  auVar68 = vpshufd_avx(ZEXT416((uint)CONCAT71((int7)(uVar22 >> 8),sVar35 < uVar34))
                                        ,0x50);
                  auVar68 = vpslld_avx(auVar68,0x1f);
                  auVar68 = vblendvps_avx(auVar69._0_16_,auVar45,auVar68);
                  auVar69 = ZEXT1664(auVar68);
                  auVar68 = vminps_avx(auVar74._0_16_,auVar56);
                  auVar74 = ZEXT1664(auVar68);
                  if (uVar34 < sVar35) {
                    uVar34 = sVar35;
                  }
                  auVar68 = vmaxps_avx(auVar59._0_16_,auVar56);
                  auVar59 = ZEXT1664(auVar68);
                  uVar33 = uVar23 + 2;
                  auVar68 = vminps_avx(auVar83._0_16_,(undefined1  [16])aVar8);
                  auVar83 = ZEXT1664(auVar68);
                  sgrids->items[local_100] =
                       (SubGridBuildData)
                       ((ulong)(uVar23 & 0xfffe | (uint)(uVar18 <= uVar33) << 0xf) |
                       (ulong)(uVar31 << 0x10 | (uint)(local_158 <= uVar31 + 2) << 0x1f) |
                       uVar25 << 0x20);
                  pPVar7 = prims->items;
                  pPVar7[local_100].lbounds.bounds0.lower.field_0.field_1 = aVar8;
                  auVar68 = vmaxps_avx(auVar81._0_16_,(undefined1  [16])aVar9);
                  auVar81 = ZEXT1664(auVar68);
                  pPVar7[local_100].lbounds.bounds0.upper.field_0.field_1 = aVar9;
                  auVar68 = vminps_avx(auVar79._0_16_,(undefined1  [16])aVar10);
                  auVar79 = ZEXT1664(auVar68);
                  pPVar7[local_100].lbounds.bounds1.lower.field_0.field_1 = aVar10;
                  auVar68 = vmaxps_avx(auVar66._0_16_,(undefined1  [16])aVar11);
                  auVar66 = ZEXT1664(auVar68);
                  pPVar7[local_100].lbounds.bounds1.upper.field_0.field_1 = aVar11;
                  pPVar7[local_100].time_range = BVar2;
                  local_100 = local_100 + 1;
                  uVar3 = *(ushort *)(lVar5 + 8 + lVar40);
                  uVar22 = (ulong)uVar3;
                  sVar35 = uVar34;
                  uVar23 = uVar33;
                } while (uVar33 < uVar3 - 1);
                uVar28 = (ulong)*(ushort *)(lVar5 + 10 + lVar40);
              }
              uVar31 = uVar31 + 2;
            } while (uVar31 < (int)uVar28 - 1U);
            uVar32 = r->_end;
          }
        }
      }
LAB_0124fe0d:
      aVar57 = auVar81._0_16_;
      aVar72 = auVar83._0_16_;
      auVar55 = auVar86._0_16_;
      auVar68 = auVar69._0_16_;
      uVar25 = uVar25 + 1;
    } while (uVar25 < uVar32);
    (__return_storage_ptr__->object_range)._end = local_110;
    aVar78 = auVar79._0_16_;
    aVar65 = auVar66._0_16_;
    aVar73 = auVar74._0_16_;
    aVar58 = auVar59._0_16_;
  }
  else {
    auVar55 = SUB6416(ZEXT464(0x3f800000),0);
    auVar68 = ZEXT816(0x3f80000000000000);
    aVar72.m128[2] = INFINITY;
    aVar72._0_8_ = 0x7f8000007f800000;
    aVar72.m128[3] = INFINITY;
    aVar57.m128[2] = -INFINITY;
    aVar57._0_8_ = 0xff800000ff800000;
    aVar57.m128[3] = -INFINITY;
    uVar34 = 0;
    local_160 = 0;
    aVar78 = aVar72;
    aVar65 = aVar57;
    aVar73 = aVar72;
    aVar58 = aVar57;
  }
  auVar68 = vmovlhps_avx(auVar68,auVar55);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar72;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar57;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar78;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar65;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar73;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar58;
  __return_storage_ptr__->num_time_segments = local_160;
  __return_storage_ptr__->max_num_time_segments = uVar34;
  (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar68._0_8_;
  (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar68._0_8_ >> 0x20);
  (__return_storage_ptr__->time_range).lower = (float)(int)auVar68._8_8_;
  (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar68._8_8_ >> 0x20);
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, mvector<SubGridBuildData>& sgrids, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const override
      {
        PrimInfoMB pinfoMB(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j, timeSegmentRange(t0t1))) continue;
          const GridMesh::Grid &g = grid(j);
          
          for (unsigned int y=0; y<g.resY-1u; y+=2)
          {
            for (unsigned int x=0; x<g.resX-1u; x+=2)
            {
              const PrimRefMB prim(linearBounds(g,x,y,t0t1),numTimeSegments(),time_range,numTimeSegments(),unsigned(geomID),unsigned(k));
              pinfoMB.add_primref(prim);
              sgrids[k] = SubGridBuildData(x | g.get3x3FlagsX(x), y | g.get3x3FlagsY(y), unsigned(j));
              prims[k++] = prim;
            }
          }
        }
        return pinfoMB;
      }